

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

void __thiscall Basis::rebuild(Basis *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  size_t i;
  ulong uVar7;
  value_type_conflict2 local_14;
  
  this->updatessinceinvert = 0;
  piVar1 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->constraintindexinbasisfactor,
             (long)(this->Atran).num_col + (long)(this->Atran).num_row,&local_14);
  HFactor::build(&this->basisfactor,(HighsTimerClock *)0x0);
  piVar1 = (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  piVar4 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  piVar5 = (this->baseindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)piVar3 - (long)piVar4 >> 2) + ((long)piVar1 - (long)piVar2 >> 2));
      uVar7 = uVar7 + 1) {
    piVar6[piVar5[uVar7]] = (int)uVar7;
  }
  this->reinversion_hint = false;
  return;
}

Assistant:

void Basis::rebuild() {
  //  report();

  updatessinceinvert = 0;
  constraintindexinbasisfactor.clear();

  constraintindexinbasisfactor.assign(Atran.num_row + Atran.num_col, -1);
  assert((HighsInt)(non_active_constraint_index.size() +
                    active_constraint_index.size()) == Atran.num_row);

  basisfactor.build();

  for (size_t i = 0;
       i < active_constraint_index.size() + non_active_constraint_index.size();
       i++) {
    constraintindexinbasisfactor[baseindex[i]] = i;
  }
  reinversion_hint = false;
}